

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int agginfoPersistExprCb(Walker *pWalker,Expr *pExpr)

{
  AggInfo *pAVar1;
  Parse *pParse_00;
  int iVar2;
  Expr *pEVar3;
  sqlite3 *db;
  Parse *pParse;
  int iAgg;
  AggInfo *pAggInfo;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (((pExpr->flags & 0x14000) == 0) && (pExpr->pAggInfo != (AggInfo *)0x0)) {
    pAVar1 = pExpr->pAggInfo;
    iVar2 = (int)pExpr->iAgg;
    pParse_00 = pWalker->pParse;
    if (pExpr->op == 0xa9) {
      if ((pAVar1->aCol[iVar2].pCExpr == pExpr) &&
         (pEVar3 = sqlite3ExprDup(pParse_00->db,pExpr,0), pEVar3 != (Expr *)0x0)) {
        pAVar1->aCol[iVar2].pCExpr = pEVar3;
        sqlite3ExprDeferredDelete(pParse_00,pEVar3);
      }
    }
    else if ((pAVar1->aFunc[iVar2].pFExpr == pExpr) &&
            (pEVar3 = sqlite3ExprDup(pParse_00->db,pExpr,0), pEVar3 != (Expr *)0x0)) {
      pAVar1->aFunc[iVar2].pFExpr = pEVar3;
      sqlite3ExprDeferredDelete(pParse_00,pEVar3);
    }
  }
  return 0;
}

Assistant:

static int agginfoPersistExprCb(Walker *pWalker, Expr *pExpr){
  if( ALWAYS(!ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced))
   && pExpr->pAggInfo!=0
  ){
    AggInfo *pAggInfo = pExpr->pAggInfo;
    int iAgg = pExpr->iAgg;
    Parse *pParse = pWalker->pParse;
    sqlite3 *db = pParse->db;
    assert( pExpr->op==TK_AGG_COLUMN || pExpr->op==TK_AGG_FUNCTION );
    if( pExpr->op==TK_AGG_COLUMN ){
      assert( iAgg>=0 && iAgg<pAggInfo->nColumn );
      if( pAggInfo->aCol[iAgg].pCExpr==pExpr ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr ){
          pAggInfo->aCol[iAgg].pCExpr = pExpr;
          sqlite3ExprDeferredDelete(pParse, pExpr);
        }
      }
    }else{
      assert( iAgg>=0 && iAgg<pAggInfo->nFunc );
      if( pAggInfo->aFunc[iAgg].pFExpr==pExpr ){
        pExpr = sqlite3ExprDup(db, pExpr, 0);
        if( pExpr ){
          pAggInfo->aFunc[iAgg].pFExpr = pExpr;
          sqlite3ExprDeferredDelete(pParse, pExpr);
        }
      }
    }
  }
  return WRC_Continue;
}